

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_coded_block_pattern
              (bitstream *str,h264_cabac_context *cabac,uint32_t mb_type,int has_chroma,
              uint32_t *val)

{
  int iVar1;
  uint uVar2;
  uint local_b0;
  uint local_ac;
  int condTermFlagB_2;
  int condTermFlagA_2;
  int condTermFlagB_1;
  int condTermFlagA_1;
  int condTermFlagB;
  int condTermFlagA;
  int idxB;
  int idxA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  h264_macroblock *mbT;
  uint local_68;
  int ctxIdx;
  uint32_t bit [6];
  int i_1;
  int i;
  int which;
  int maxval;
  int (*tab) [2];
  uint32_t *puStack_30;
  uint32_t tmp;
  uint32_t *val_local;
  int has_chroma_local;
  uint32_t mb_type_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  puStack_30 = val;
  val_local._0_4_ = has_chroma;
  val_local._4_4_ = mb_type;
  _has_chroma_local = cabac;
  cabac_local = (h264_cabac_context *)str;
  if (cabac == (h264_cabac_context *)0x0) {
    tab._4_4_ = 0xffffffff;
    if (has_chroma == 0) {
      _which = cbpl;
      i = 0x10;
    }
    else {
      _which = cbplc;
      i = 0x30;
    }
    i_1 = (int)(0x1a < mb_type);
    if (str->dir == VS_ENCODE) {
      if ((uint)i <= *val) {
        fprintf(_stderr,"coded_block_pattern too large\n");
        return 1;
      }
      for (bit[5] = 0; (int)bit[5] < i; bit[5] = bit[5] + 1) {
        if (_which[(int)bit[5]][i_1] == *val) {
          tab._4_4_ = bit[5];
        }
      }
    }
    iVar1 = vs_ue(str,(uint32_t *)((long)&tab + 4));
    if (iVar1 == 0) {
      if (*(int *)&cabac_local->slice == 1) {
        if ((uint)i <= tab._4_4_) {
          fprintf(_stderr,"coded_block_pattern too large\n");
          return 1;
        }
        *puStack_30 = _which[tab._4_4_][i_1];
      }
      str_local._4_4_ = 0;
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  else {
    memset(&local_68,0,0x18);
    mbA = h264_mb_nb(_has_chroma_local->slice,H264_MB_THIS,0);
    mbB = h264_mb_nb(_has_chroma_local->slice,H264_MB_A,0);
    _idxB = h264_mb_nb(_has_chroma_local->slice,H264_MB_B,0);
    if (*(int *)&cabac_local->slice == 0) {
      uVar2 = 0x10;
      if ((int)val_local != 0) {
        uVar2 = 0x30;
      }
      if (uVar2 <= *puStack_30) {
        fprintf(_stderr,"coded_block_pattern too large\n");
        return 1;
      }
      local_68 = *puStack_30 & 1;
      ctxIdx = *puStack_30 >> 1 & 1;
      bit[0] = *puStack_30 >> 2 & 1;
      bit[1] = *puStack_30 >> 3 & 1;
      bit[2] = (uint32_t)(*puStack_30 >> 4 != 0);
      bit[3] = (uint32_t)(1 < *puStack_30 >> 4);
    }
    for (bit[4] = 0; (int)bit[4] < 4; bit[4] = bit[4] + 1) {
      mbB = h264_mb_nb_b(_has_chroma_local->slice,H264_MB_A,H264_BLOCK_8X8,0,bit[4],&condTermFlagA);
      _idxB = h264_mb_nb_b(_has_chroma_local->slice,H264_MB_B,H264_BLOCK_8X8,0,bit[4],&condTermFlagB
                          );
      if (mbB == mbA) {
        local_ac = (&local_68)[condTermFlagA];
      }
      else {
        local_ac = mbB->coded_block_pattern >> ((byte)condTermFlagA & 0x1f) & 1;
      }
      if (_idxB == mbA) {
        local_b0 = (&local_68)[condTermFlagB];
      }
      else {
        local_b0 = _idxB->coded_block_pattern >> ((byte)condTermFlagB & 0x1f) & 1;
      }
      mbT._4_4_ = ((local_ac != 0 ^ 0xffU) & 1) + 0x49 + (uint)((local_b0 != 0 ^ 0xffU) & 1) * 2;
      iVar1 = h264_cabac_decision((bitstream *)cabac_local,_has_chroma_local,mbT._4_4_,
                                  &local_68 + (int)bit[4]);
      if (iVar1 != 0) {
        return 1;
      }
    }
    if ((int)val_local != 0) {
      mbB = h264_mb_nb(_has_chroma_local->slice,H264_MB_A,0);
      _idxB = h264_mb_nb(_has_chroma_local->slice,H264_MB_B,0);
      mbT._4_4_ = (mbB->coded_block_pattern >> 4 != 0) + 0x4d +
                  (uint)(_idxB->coded_block_pattern >> 4 != 0) * 2;
      iVar1 = h264_cabac_decision((bitstream *)cabac_local,_has_chroma_local,mbT._4_4_,bit + 2);
      if (iVar1 != 0) {
        return 1;
      }
      if (bit[2] != 0) {
        mbT._4_4_ = (uint)(1 < mbB->coded_block_pattern >> 4) +
                    (uint)(1 < _idxB->coded_block_pattern >> 4) * 2 + 0x51;
        iVar1 = h264_cabac_decision((bitstream *)cabac_local,_has_chroma_local,mbT._4_4_,bit + 3);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    if (*(int *)&cabac_local->slice == 1) {
      *puStack_30 = local_68 | ctxIdx << 1 | bit[0] << 2 | bit[1] << 3 |
                    bit[2] << ((char)bit[3] + 4U & 0x1f);
    }
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int h264_coded_block_pattern(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t mb_type, int has_chroma, uint32_t *val) {
	if (!cabac) {
		uint32_t tmp = -1;
		const int (*tab)[2];
		int maxval;
		int which;
		if (has_chroma) {
			tab = cbplc;
			maxval = 48;
		} else {
			tab = cbpl;
			maxval = 16;
		}
		if (mb_type <= H264_MB_TYPE_SI)
			which = 0;
		else
			which = 1;
		if (str->dir == VS_ENCODE) {
			if (*val >= maxval) {
				fprintf(stderr, "coded_block_pattern too large\n");
				return 1;
			}
			int i;
			for (i = 0; i < maxval; i++) {
				if (tab[i][which] == *val)
					tmp = i;
			}
		}
		if (vs_ue(str, &tmp))
			return 1;
		if (str->dir == VS_DECODE) {
			if (tmp >= maxval) {
				fprintf(stderr, "coded_block_pattern too large\n");
				return 1;
			}
			*val = tab[tmp][which];
		}
		return 0;
	} else {
		int i;
		uint32_t bit[6] = { 0 };
		int ctxIdx;
		const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
		const struct h264_macroblock *mbA;
		const struct h264_macroblock *mbB;
		int idxA;
		int idxB;
		mbA = h264_mb_nb(cabac->slice, H264_MB_A, 0);
		mbB = h264_mb_nb(cabac->slice, H264_MB_B, 0);
		if (str->dir == VS_ENCODE) {
			if (*val >= (has_chroma?48:16)) {
				fprintf(stderr, "coded_block_pattern too large\n");
				return 1;
			}
			bit[0] = *val >> 0 & 1;
			bit[1] = *val >> 1 & 1;
			bit[2] = *val >> 2 & 1;
			bit[3] = *val >> 3 & 1;
			bit[4] = *val >> 4 > 0;
			bit[5] = *val >> 4 > 1;
		}
		for (i = 0; i < 4; i++) {
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, 0, i, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, 0, i, &idxB);
			int condTermFlagA = !(mbA == mbT ? bit[idxA] : mbA->coded_block_pattern >> idxA & 1);
			int condTermFlagB = !(mbB == mbT ? bit[idxB] : mbB->coded_block_pattern >> idxB & 1);
			ctxIdx = H264_CABAC_CTXIDX_CODED_BLOCK_PATTERN_LUMA + condTermFlagA + condTermFlagB * 2;
			if (h264_cabac_decision(str, cabac, ctxIdx, &bit[i])) return 1;
		}
		if (has_chroma) {
			mbA = h264_mb_nb(cabac->slice, H264_MB_A, 0);
			mbB = h264_mb_nb(cabac->slice, H264_MB_B, 0);
			int condTermFlagA = (mbA->coded_block_pattern >> 4) > 0;
			int condTermFlagB = (mbB->coded_block_pattern >> 4) > 0;
			ctxIdx = H264_CABAC_CTXIDX_CODED_BLOCK_PATTERN_CHROMA + condTermFlagA + condTermFlagB * 2;
			if (h264_cabac_decision(str, cabac, ctxIdx, &bit[4])) return 1;
			if (bit[4]) {
				int condTermFlagA = (mbA->coded_block_pattern >> 4) > 1;
				int condTermFlagB = (mbB->coded_block_pattern >> 4) > 1;
				ctxIdx = H264_CABAC_CTXIDX_CODED_BLOCK_PATTERN_CHROMA + condTermFlagA + condTermFlagB * 2 + 4;
				if (h264_cabac_decision(str, cabac, ctxIdx, &bit[5])) return 1;
			}
		}
		if (str->dir == VS_DECODE) {
			*val = bit[0] | bit[1] << 1 | bit[2] << 2 | bit[3] << 3 | bit[4] << (4+bit[5]);
		}
		return 0;
	}
}